

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestHelper.h
# Opt level: O0

socket_handle FIX::createSocket(uint16_t port,char *address)

{
  int iVar1;
  undefined1 local_2c [4];
  int result;
  sockaddr_in addr;
  socket_handle sock;
  char *address_local;
  uint16_t port_local;
  
  unique0x1000007d = address;
  addr.sin_zero._0_4_ = socket(2,1,6);
  local_2c._0_2_ = 2;
  local_2c._2_2_ = htons(port);
  result = inet_addr(stack0xffffffffffffffe8);
  iVar1 = connect(addr.sin_zero._0_4_,(sockaddr *)local_2c,0x10);
  if (iVar1 == 0) {
    address_local._4_1_ = addr.sin_zero[0];
    address_local._5_1_ = addr.sin_zero[1];
    address_local._6_1_ = addr.sin_zero[2];
    address_local._7_1_ = addr.sin_zero[3];
  }
  else {
    destroySocket(addr.sin_zero._0_4_);
    address_local._4_4_ = -1;
  }
  return address_local._4_4_;
}

Assistant:

socket_handle inline createSocket(uint16_t port, const char *address) {
  socket_handle sock = socket(PF_INET, SOCK_STREAM, IPPROTO_TCP);

  sockaddr_in addr;
  addr.sin_family = PF_INET;
  addr.sin_port = htons(port);
  addr.sin_addr.s_addr = inet_addr(address);

  int result = ::connect(sock, reinterpret_cast<sockaddr *>(&addr), sizeof(addr));
  if (result != 0) {
    destroySocket(sock);
    return INVALID_SOCKET_HANDLE;
  }
  return sock;
}